

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strrchr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  undefined8 in_RAX;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  char *zIn;
  int nLen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if ((1 < nArg) && (pcVar5 = jx9_value_to_string(*apArg,&local_24), 0 < local_24)) {
    pjVar1 = apArg[1];
    if ((pjVar1->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar1);
      iVar7 = *(int *)&pjVar1->x;
    }
    else {
      pcVar6 = jx9_value_to_string(pjVar1,(int *)0x0);
      iVar7 = (int)*pcVar6;
    }
    uVar4 = local_24 - 4;
    uVar8 = (ulong)(local_24 - 1);
    do {
      if (iVar7 == pcVar5[uVar8]) {
        bVar2 = true;
        uVar4 = (uint)uVar8;
        goto LAB_00132602;
      }
      if (pcVar5 + (uVar8 - 1) < pcVar5) break;
      if (iVar7 == pcVar5[uVar8 - 1]) {
        uVar4 = uVar4 + 2;
LAB_00132600:
        bVar2 = true;
        goto LAB_00132602;
      }
      if (pcVar5 + (uVar8 - 2) < pcVar5) break;
      if (iVar7 == pcVar5[uVar8 - 2]) {
        uVar4 = uVar4 + 1;
        goto LAB_00132600;
      }
      if (pcVar5 + (uVar8 - 3) < pcVar5) break;
      if (iVar7 == pcVar5[uVar8 - 3]) goto LAB_00132600;
      uVar4 = uVar4 - 4;
      lVar3 = uVar8 - 4;
      uVar8 = uVar8 - 4;
    } while (pcVar5 <= pcVar5 + lVar3);
    bVar2 = false;
LAB_00132602:
    if (bVar2) {
      jx9_value_string(pCtx->pRet,pcVar5 + uVar4,local_24 - uVar4);
      return 0;
    }
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).rVal = 0.0;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strrchr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zBlob;
	int nLen, c;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	c = 0; /* cc warning */
	if( nLen > 0 ){
		sxu32 nOfft;
		sxi32 rc;
		if( jx9_value_is_string(apArg[1]) ){
			const char *zPattern;
			zPattern = jx9_value_to_string(apArg[1], 0); /* Never fail, so there is no need to check
														 * for NULL pointer.
														 */
			c = zPattern[0];
		}else{
			/* Int cast */
			c = jx9_value_to_int(apArg[1]);
		}
		/* Perform the lookup */
		rc = SyByteFind2(zBlob, (sxu32)nLen, c, &nOfft);
		if( rc != SXRET_OK ){
			/* No such entry, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the string portion */
		jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}